

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartList.cpp
# Opt level: O1

void __thiscall PartList::Draw(PartList *this,char *title,bool *p_open,Board *board)

{
  KeyBindings *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 uVar4;
  long lVar5;
  ImVec2 IVar6;
  ImGuiListClipper clipper;
  string part_name;
  SharedVector<Component> parts;
  ImVec2 local_a8;
  undefined1 local_a0 [48];
  ImVec2 local_70 [2];
  long local_60 [2];
  bool *local_50;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> local_48;
  
  local_a0._0_4_ = 400.0;
  local_a0._4_4_ = 640.0;
  ImGui::SetNextWindowSize((ImVec2 *)local_a0,0);
  ImGui::Begin(title,p_open,0);
  ImGui::Columns(1,"part_infos",true);
  ImGui::Separator();
  ImGui::Text("Name");
  ImGui::NextColumn();
  ImGui::Separator();
  if (board != (Board *)0x0) {
    iVar3 = (*board->_vptr_Board[3])(board);
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::vector
              (&local_48,
               (vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
               CONCAT44(extraout_var,iVar3));
    local_70[0] = (ImVec2)local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
    ImGuiListClipper::ImGuiListClipper((ImGuiListClipper *)local_a0);
    local_50 = p_open;
    ImGuiListClipper::Begin
              ((ImGuiListClipper *)local_a0,
               (int)((ulong)((long)local_48.
                                   super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_48.
                                  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4),-1.0);
    while (bVar1 = ImGuiListClipper::Step((ImGuiListClipper *)local_a0), bVar1) {
      lVar5 = (long)(int)local_a0._8_4_;
      if ((int)local_a0._8_4_ < (int)local_a0._12_4_) {
        IVar6 = (ImVec2)(lVar5 << 4);
        do {
          std::__cxx11::string::_M_assign((string *)local_70);
          local_a8.x = 0.0;
          local_a8.y = 0.0;
          bVar1 = ImGui::Selectable((char *)local_70[0],(int)lVar5 == Draw::selected,4,&local_a8);
          if ((bVar1) &&
             (Draw::selected = (int)lVar5, bVar1 = ImGui::IsMouseDoubleClicked(0), bVar1)) {
            local_a8 = local_70[0];
            if ((this->cbNetSelected_).super__Function_base._M_manager == (_Manager_type)0x0) {
              uVar4 = std::__throw_bad_function_call();
              if ((ImVec2)local_a0._0_8_ != IVar6) {
                operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
              }
              _Unwind_Resume(uVar4);
            }
            (*(this->cbNetSelected_)._M_invoker)
                      ((_Any_data *)&this->cbNetSelected_,(char **)&local_a8);
          }
          ImGui::NextColumn();
          lVar5 = lVar5 + 1;
          IVar6 = (ImVec2)((long)IVar6 + 0x10);
        } while (lVar5 < (int)local_a0._12_4_);
      }
    }
    ImGuiListClipper::End((ImGuiListClipper *)local_a0);
    ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)local_a0);
    p_open = local_50;
    if (local_70[0] != (ImVec2)local_60) {
      operator_delete((void *)local_70[0],local_60[0] + 1);
    }
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
              (&local_48);
  }
  bVar1 = false;
  ImGui::Columns(1,(char *)0x0,true);
  ImGui::Separator();
  bVar2 = ImGui::IsWindowHovered(0);
  if (bVar2) {
    this_00 = this->keyBindings;
    local_a0._0_8_ = (long)local_a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"CloseDialog","");
    bVar1 = KeyBindings::isPressed(this_00,(string *)local_a0);
    if (local_a0._0_8_ != (long)local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
  }
  if (bVar1 != false) {
    *p_open = false;
  }
  ImGui::End();
  return;
}

Assistant:

void PartList::Draw(const char *title, bool *p_open, Board *board) {
	// TODO: export / fix dimensions & behaviour
	int width  = 400;
	int height = 640;

	ImGui::SetNextWindowSize(ImVec2(width, height));
	ImGui::Begin(title, p_open);

	ImGui::Columns(1, "part_infos");
	ImGui::Separator();

	ImGui::Text("Name");
	ImGui::NextColumn();
	ImGui::Separator();

	if (board) {
		auto parts = board->Components();

		static int selected = -1;
		std::string part_name    = "";
		ImGuiListClipper clipper;
		clipper.Begin(parts.size());
		while (clipper.Step()) {
			for (int i = clipper.DisplayStart; i < clipper.DisplayEnd; i++) {
				part_name = parts[i]->name;

				if (ImGui::Selectable(part_name.c_str(), selected == i, ImGuiSelectableFlags_AllowDoubleClick)) {
					selected = i;
					if (ImGui::IsMouseDoubleClicked(0)) {
						cbNetSelected_(part_name.c_str());
					}
				}
				ImGui::NextColumn();
			}
		}
		clipper.End();
	}
	ImGui::Columns(1);
	ImGui::Separator();

	if (ImGui::IsWindowHovered() && keyBindings.isPressed("CloseDialog")) {
		*p_open = false;
	}

	ImGui::End();
}